

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O3

void Bbl_ManDumpBlif(Bbl_Man_t *p,char *pFileName)

{
  uint uVar1;
  FILE *__s;
  uint *puVar2;
  Vec_Str_t *pVVar3;
  uint uVar4;
  char *__format;
  uint *puVar5;
  uint *puVar6;
  ulong uVar7;
  
  __s = fopen(pFileName,"w");
  fwrite("# Test file written by Bbl_ManDumpBlif() in ABC.\n",0x31,1,__s);
  fprintf(__s,".model %s\n",p->pName->pArray);
  puVar5 = (uint *)p->pObjs->pArray;
  if (puVar5 != (uint *)0x0) {
    do {
      if ((puVar5[2] & 1) == 0) {
        if ((puVar5[2] & 2) != 0) {
          uVar4 = *puVar5;
          __format = ".outputs %d\n";
          goto LAB_0044ef17;
        }
        fwrite(".names",6,1,__s);
        if (0xf < puVar5[2]) {
          puVar6 = puVar5 + 3;
          puVar2 = puVar6;
          while( true ) {
            uVar4 = *puVar2;
            uVar7 = 0;
            fprintf(__s," %d",(ulong)*(uint *)((long)puVar5 - (long)(int)uVar4));
            uVar1 = puVar5[2] >> 4;
            if (0xf < puVar5[2]) {
              uVar7 = 0;
              while (uVar4 != puVar6[uVar7]) {
                uVar7 = uVar7 + 1;
                if (uVar1 == uVar7) goto LAB_0044eec2;
              }
            }
            if ((int)(uVar1 - 1) <= (int)uVar7) break;
            puVar2 = puVar6 + (uVar7 & 0xffffffff) + 1;
          }
        }
LAB_0044eec2:
        fprintf(__s," %d\n",(ulong)*puVar5);
        fputs(p->pFncs->pArray + (long)(int)puVar5[1] + 4,__s);
      }
      else {
        uVar4 = *puVar5;
        __format = ".inputs %d\n";
LAB_0044ef17:
        fprintf(__s,__format,(ulong)uVar4);
      }
      puVar5 = puVar5 + (ulong)(puVar5[2] >> 4) + 3;
      pVVar3 = p->pObjs;
      puVar6 = (uint *)pVVar3->pArray;
    } while (puVar5 < (uint *)((long)pVVar3->nSize + (long)puVar6));
    if (puVar6 != (uint *)0x0) {
      do {
        uVar4 = puVar6[2];
        if ((uVar4 & 2) != 0) {
          fwrite(".names",6,1,__s);
          if (0xf < puVar6[2]) {
            puVar5 = puVar6 + 3;
            puVar2 = puVar5;
            while( true ) {
              uVar4 = *puVar2;
              uVar7 = 0;
              fprintf(__s," %d",(ulong)*(uint *)((long)puVar6 - (long)(int)uVar4));
              uVar1 = puVar6[2] >> 4;
              if (0xf < puVar6[2]) {
                uVar7 = 0;
                while (uVar4 != puVar5[uVar7]) {
                  uVar7 = uVar7 + 1;
                  if (uVar1 == uVar7) goto LAB_0044efd5;
                }
              }
              if ((int)(uVar1 - 1) <= (int)uVar7) break;
              puVar2 = puVar5 + (uVar7 & 0xffffffff) + 1;
            }
          }
LAB_0044efd5:
          fprintf(__s," %d\n",(ulong)*puVar6);
          fwrite("1 1\n",4,1,__s);
          uVar4 = puVar6[2];
          pVVar3 = p->pObjs;
        }
        puVar6 = puVar6 + (ulong)(uVar4 >> 4) + 3;
      } while (puVar6 < pVVar3->pArray + pVVar3->nSize);
    }
  }
  fwrite(".end\n",5,1,__s);
  fclose(__s);
  return;
}

Assistant:

void Bbl_ManDumpBlif( Bbl_Man_t * p, char * pFileName )
{
    FILE * pFile;
    Bbl_Obj_t * pObj, * pFanin;
    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# Test file written by Bbl_ManDumpBlif() in ABC.\n" );
    fprintf( pFile, ".model %s\n", Bbl_ManName(p) );
    // write objects
    Bbl_ManForEachObj( p, pObj )
    {
        if ( Bbl_ObjIsInput(pObj) )
            fprintf( pFile, ".inputs %d\n", Bbl_ObjId(pObj) );
        else if ( Bbl_ObjIsOutput(pObj) )
            fprintf( pFile, ".outputs %d\n", Bbl_ObjId(pObj) );
        else if ( Bbl_ObjIsLut(pObj) )
        {
            fprintf( pFile, ".names" );
            Bbl_ObjForEachFanin( pObj, pFanin )
                fprintf( pFile, " %d", Bbl_ObjId(pFanin) );
            fprintf( pFile, " %d\n", Bbl_ObjId(pObj) );
            fprintf( pFile, "%s", Bbl_ObjSop(p, pObj) );
        }
        else assert( 0 );
    }
    // write output drivers
    Bbl_ManForEachObj( p, pObj )
    {
        if ( !Bbl_ObjIsOutput(pObj) )
            continue;
        fprintf( pFile, ".names" );
        Bbl_ObjForEachFanin( pObj, pFanin )
            fprintf( pFile, " %d", Bbl_ObjId(pFanin) );
        fprintf( pFile, " %d\n", Bbl_ObjId(pObj) );
        fprintf( pFile, "1 1\n" );
    }
    fprintf( pFile, ".end\n" );
    fclose( pFile );
}